

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less_equal *comp)

{
  size_t sVar1;
  less_equal *plVar2;
  xpath_node *pxVar3;
  char_t *pcVar4;
  xpath_string xVar5;
  xpath_string local_250;
  double local_240;
  undefined1 local_238 [8];
  xpath_allocator_capture cri_2;
  xpath_node *li_1;
  double r;
  xpath_node_set_raw ls_1;
  xpath_allocator_capture cr_2;
  xpath_string local_1c8;
  double local_1b8;
  undefined1 local_1b0 [8];
  xpath_allocator_capture cri_1;
  xpath_node *ri_1;
  xpath_node_set_raw rs_1;
  double l_1;
  xpath_allocator_capture cr_1;
  xpath_string local_138;
  double local_128;
  undefined1 local_120 [8];
  xpath_allocator_capture crii;
  xpath_node *ri;
  xpath_string local_f0;
  double local_e0;
  double l;
  xpath_allocator_capture cri;
  xpath_node *li;
  xpath_node_set_raw rs;
  undefined1 local_88 [8];
  xpath_node_set_raw ls;
  xpath_allocator_capture cr;
  double local_48;
  xpath_value_type local_40;
  xpath_value_type local_3c;
  xpath_value_type rt;
  xpath_value_type lt;
  less_equal *comp_local;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *rhs_local;
  xpath_ast_node *lhs_local;
  
  _rt = comp;
  comp_local = (less_equal *)stack;
  stack_local = (xpath_stack *)c;
  c_local = (xpath_context *)rhs;
  rhs_local = lhs;
  local_3c = rettype(lhs);
  local_40 = rettype((xpath_ast_node *)c_local);
  plVar2 = _rt;
  if ((local_3c == xpath_type_node_set) || (local_40 == xpath_type_node_set)) {
    if ((local_3c == xpath_type_node_set) && (local_40 == xpath_type_node_set)) {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&ls._eos,*(xpath_allocator **)comp_local);
      eval_node_set((xpath_node_set_raw *)local_88,rhs_local,(xpath_context *)stack_local,
                    (xpath_stack *)comp_local);
      eval_node_set((xpath_node_set_raw *)&li,(xpath_ast_node *)c_local,(xpath_context *)stack_local
                    ,(xpath_stack *)comp_local);
      for (cri._state._root_size = (size_t)xpath_node_set_raw::begin((xpath_node_set_raw *)local_88)
          ; sVar1 = cri._state._root_size,
          pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)local_88),
          (xpath_node *)sVar1 != pxVar3; cri._state._root_size = cri._state._root_size + 0x10) {
        xpath_allocator_capture::xpath_allocator_capture
                  ((xpath_allocator_capture *)&l,*(xpath_allocator **)comp_local);
        xVar5 = string_value((xpath_node *)cri._state._root_size,*(xpath_allocator **)comp_local);
        local_f0._buffer = xVar5._buffer;
        local_f0._uses_heap = xVar5._uses_heap;
        pcVar4 = xpath_string::c_str(&local_f0);
        local_e0 = convert_string_to_number(pcVar4);
        for (crii._state._root_size = (size_t)xpath_node_set_raw::begin((xpath_node_set_raw *)&li);
            sVar1 = crii._state._root_size,
            pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&li),
            (xpath_node *)sVar1 != pxVar3; crii._state._root_size = crii._state._root_size + 0x10) {
          xpath_allocator_capture::xpath_allocator_capture
                    ((xpath_allocator_capture *)local_120,*(xpath_allocator **)comp_local);
          plVar2 = _rt;
          xVar5 = string_value((xpath_node *)crii._state._root_size,*(xpath_allocator **)comp_local)
          ;
          local_138._buffer = xVar5._buffer;
          local_138._uses_heap = xVar5._uses_heap;
          pcVar4 = xpath_string::c_str(&local_138);
          local_128 = convert_string_to_number(pcVar4);
          cr_1._state._root_size._4_1_ =
               (anonymous_namespace)::less_equal::operator()(plVar2,&local_e0,&local_128);
          if (cr_1._state._root_size._4_1_) {
            lhs_local._7_1_ = 1;
          }
          cr_1._state._root_size._5_3_ = 0;
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_120);
          if (cr_1._state._root_size._4_4_ != 0) goto LAB_0013eb09;
        }
        cr_1._state._root_size._4_4_ = 0;
LAB_0013eb09:
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&l);
        if (cr_1._state._root_size._4_4_ != 0) goto LAB_0013eb56;
      }
      lhs_local._7_1_ = 0;
      cr_1._state._root_size._4_4_ = 1;
LAB_0013eb56:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ls._eos);
    }
    else if ((local_3c == xpath_type_node_set) || (local_40 != xpath_type_node_set)) {
      if ((local_3c != xpath_type_node_set) || (local_40 == xpath_type_node_set)) {
        __assert_fail("!\"Wrong types\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                      ,0x1d8b,
                      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less_equal]"
                     );
      }
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&ls_1._eos,*(xpath_allocator **)comp_local);
      eval_node_set((xpath_node_set_raw *)&r,rhs_local,(xpath_context *)stack_local,
                    (xpath_stack *)comp_local);
      li_1 = (xpath_node *)
             eval_number((xpath_ast_node *)c_local,(xpath_context *)stack_local,
                         (xpath_stack *)comp_local);
      for (cri_2._state._root_size = (size_t)xpath_node_set_raw::begin((xpath_node_set_raw *)&r);
          sVar1 = cri_2._state._root_size,
          pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&r), (xpath_node *)sVar1 != pxVar3;
          cri_2._state._root_size = cri_2._state._root_size + 0x10) {
        xpath_allocator_capture::xpath_allocator_capture
                  ((xpath_allocator_capture *)local_238,*(xpath_allocator **)comp_local);
        plVar2 = _rt;
        xVar5 = string_value((xpath_node *)cri_2._state._root_size,*(xpath_allocator **)comp_local);
        local_250._buffer = xVar5._buffer;
        local_250._uses_heap = xVar5._uses_heap;
        pcVar4 = xpath_string::c_str(&local_250);
        local_240 = convert_string_to_number(pcVar4);
        cr_1._state._root_size._4_1_ =
             (anonymous_namespace)::less_equal::operator()(plVar2,&local_240,(double *)&li_1);
        if (cr_1._state._root_size._4_1_) {
          lhs_local._7_1_ = 1;
        }
        cr_1._state._root_size._5_3_ = 0;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_238);
        if (cr_1._state._root_size._4_4_ != 0) goto LAB_0013effe;
      }
      lhs_local._7_1_ = 0;
      cr_1._state._root_size._4_4_ = 1;
LAB_0013effe:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ls_1._eos);
    }
    else {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&l_1,*(xpath_allocator **)comp_local);
      rs_1._eos = (xpath_node *)
                  eval_number(rhs_local,(xpath_context *)stack_local,(xpath_stack *)comp_local);
      eval_node_set((xpath_node_set_raw *)&ri_1,(xpath_ast_node *)c_local,
                    (xpath_context *)stack_local,(xpath_stack *)comp_local);
      for (cri_1._state._root_size = (size_t)xpath_node_set_raw::begin((xpath_node_set_raw *)&ri_1);
          sVar1 = cri_1._state._root_size,
          pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&ri_1),
          (xpath_node *)sVar1 != pxVar3; cri_1._state._root_size = cri_1._state._root_size + 0x10) {
        xpath_allocator_capture::xpath_allocator_capture
                  ((xpath_allocator_capture *)local_1b0,*(xpath_allocator **)comp_local);
        plVar2 = _rt;
        xVar5 = string_value((xpath_node *)cri_1._state._root_size,*(xpath_allocator **)comp_local);
        local_1c8._buffer = xVar5._buffer;
        local_1c8._uses_heap = xVar5._uses_heap;
        pcVar4 = xpath_string::c_str(&local_1c8);
        local_1b8 = convert_string_to_number(pcVar4);
        cr_1._state._root_size._4_1_ =
             (anonymous_namespace)::less_equal::operator()(plVar2,(double *)&rs_1._eos,&local_1b8);
        if (cr_1._state._root_size._4_1_) {
          lhs_local._7_1_ = 1;
        }
        cr_1._state._root_size._5_3_ = 0;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_1b0);
        if (cr_1._state._root_size._4_4_ != 0) goto LAB_0013eda7;
      }
      lhs_local._7_1_ = 0;
      cr_1._state._root_size._4_4_ = 1;
LAB_0013eda7:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&l_1);
    }
  }
  else {
    local_48 = eval_number(rhs_local,(xpath_context *)stack_local,(xpath_stack *)comp_local);
    cr._state._root_size =
         (size_t)eval_number((xpath_ast_node *)c_local,(xpath_context *)stack_local,
                             (xpath_stack *)comp_local);
    lhs_local._7_1_ =
         (anonymous_namespace)::less_equal::operator()
                   (plVar2,&local_48,(double *)&cr._state._root_size);
  }
  return (bool)(lhs_local._7_1_ & 1);
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(!"Wrong types");
				return false;
			}
		}